

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::BufferID>::emplaceRealloc<slang::BufferID>
          (SmallVectorBase<slang::BufferID> *this,pointer pos,BufferID *args)

{
  size_type sVar1;
  size_type sVar2;
  size_type capacity;
  iterator pBVar3;
  BufferID *__result;
  BufferID *pBVar4;
  EVP_PKEY_CTX *ctx;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  BufferID *args_local;
  pointer pos_local;
  SmallVectorBase<slang::BufferID> *this_local;
  
  sVar1 = this->len;
  sVar2 = max_size(this);
  if (sVar1 == sVar2) {
    slang::detail::throwLengthError();
  }
  capacity = calculateGrowth(this,this->len + 1);
  pBVar3 = begin(this);
  __result = (BufferID *)slang::detail::allocArray(capacity,4);
  pBVar4 = __result + ((long)pos - (long)pBVar3 >> 2);
  pBVar4->id = args->id;
  pBVar3 = end(this);
  if (pos == pBVar3) {
    pBVar3 = begin(this);
    ctx = (EVP_PKEY_CTX *)end(this);
    std::uninitialized_move<slang::BufferID*,slang::BufferID*>(pBVar3,(BufferID *)ctx,__result);
  }
  else {
    pBVar3 = begin(this);
    std::uninitialized_move<slang::BufferID*,slang::BufferID*>(pBVar3,pos,__result);
    ctx = (EVP_PKEY_CTX *)end(this);
    std::uninitialized_move<slang::BufferID*,slang::BufferID*>(pos,(BufferID *)ctx,pBVar4 + 1);
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = capacity;
  this->data_ = __result;
  return pBVar4;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}